

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *picturesPath;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  int iVar3;
  GLFWmonitor *pGVar4;
  GLFWvidmode *pGVar5;
  ostream *poVar6;
  GLFWwindow *handle;
  undefined8 uVar7;
  int lineNo;
  int lineNo_00;
  int lineNo_01;
  int height;
  Renderer renderer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  picturePaths;
  MesmerizeOptions options;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  ManualTicker manualTicker;
  runtime_error e;
  string local_110 [224];
  
  if (argc != 1) {
    MesmerizeOptions::MesmerizeOptions(&options);
    MesmerizeOptions::FromArgs((MesmerizeOptions *)&e,argc,argv);
    MesmerizeOptions::operator=(&options,(MesmerizeOptions *)&e);
    std::__cxx11::string::~string(local_110);
    picturesPath = &options.PathToPicturesFolder;
    GetShuffledPicturePaths::GetShuffledPicturePaths(&picturePaths,picturesPath);
    if (picturePaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        picturePaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Folder ");
      poVar6 = std::operator<<(poVar6,(string *)picturesPath);
      iVar3 = 0;
      std::operator<<(poVar6," has no pictures (.jpg or .png)\n");
    }
    else {
      PictureRendererWithTransition::PictureRendererWithTransition
                ((PictureRendererWithTransition *)&e,options.PanAnimationDuration,
                 options.ZoomAnimationDuration,options.OpacityAnimationDuration,
                 options.PanPercentage,options.ZoomPercentage);
      iVar2 = glfwInit();
      iVar3 = -1;
      if (iVar2 != 0) {
        pGVar4 = glfwGetPrimaryMonitor();
        pGVar5 = glfwGetVideoMode(pGVar4);
        iVar2 = pGVar5->width;
        height = pGVar5->height;
        if (options.IsFullScreen == true) {
          if (options.IsResolutionSetToMax == false) {
            pGVar4 = glfwGetPrimaryMonitor();
            iVar2 = options.ResolutionX;
            height = options.ResolutionY;
          }
          else {
            pGVar4 = glfwGetPrimaryMonitor();
          }
        }
        else if (options.IsResolutionSetToMax == false) {
          pGVar4 = (GLFWmonitor *)0x0;
          iVar2 = options.ResolutionX;
          height = options.ResolutionY;
        }
        else {
          pGVar4 = (GLFWmonitor *)0x0;
        }
        handle = glfwCreateWindow(iVar2,height,"Mesmerize",pGVar4,(GLFWwindow *)0x0);
        if (handle == (GLFWwindow *)0x0) {
          glfwTerminate();
        }
        else {
          glfwMakeContextCurrent(handle);
          glfwSetKeyCallback(handle,main::anon_class_1_0_00000001::__invoke);
          DeviceInformation::init((EVP_PKEY_CTX *)handle);
          iVar3 = glewInit();
          __stream = _stderr;
          if (iVar3 != 0) {
            uVar7 = glewGetErrorString(iVar3);
            fprintf(__stream,"Error: %s\n",uVar7);
          }
          ClearGlErrors();
          glEnable(0xbe2);
          bVar1 = GlLogCall("glEnable(GL_BLEND)",(char *)0x7a,lineNo);
          if (!bVar1) {
            raise(5);
          }
          ClearGlErrors();
          glBlendFunc(0x302,0x303);
          bVar1 = GlLogCall("glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA)",(char *)0x7b,
                            lineNo_00);
          if (!bVar1) {
            raise(5);
          }
          ClearGlErrors();
          (*___glewBlendEquation)(0x8006);
          bVar1 = GlLogCall("glBlendEquation(GL_FUNC_ADD)",(char *)0x7c,lineNo_01);
          if (!bVar1) {
            raise(5);
          }
          Picture::InitShaders();
          glfwSwapInterval(1);
          local_1a8._M_unused._M_object = (void *)0x0;
          local_1a8._8_8_ = 0;
          local_198 = (code *)0x0;
          pcStack_190 = (code *)0x0;
          local_1a8._M_unused._M_object = operator_new(0x18);
          *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            **)local_1a8._M_unused._0_8_ = &picturePaths;
          *(ManualTicker **)((long)local_1a8._M_unused._0_8_ + 8) = &manualTicker;
          *(runtime_error **)((long)local_1a8._M_unused._0_8_ + 0x10) = &e;
          pcStack_190 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp:134:31)>
                        ::_M_invoke;
          local_198 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp:134:31)>
                      ::_M_manager;
          ManualTicker::ManualTicker
                    (&manualTicker,(function<void_()> *)&local_1a8,
                     (double)options.DisplayPictureDuration);
          std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
          while (iVar3 = glfwWindowShouldClose(handle), iVar3 == 0) {
            ManualTicker::Tick(&manualTicker);
            Renderer::Clear(&renderer);
            PictureRendererWithTransition::Render((PictureRendererWithTransition *)&e);
            glfwSwapBuffers(handle);
            glfwPollEvents();
          }
          glfwTerminate();
          std::_Function_base::~_Function_base((_Function_base *)&manualTicker);
          iVar3 = 0;
        }
      }
      PictureRendererWithTransition::~PictureRendererWithTransition
                ((PictureRendererWithTransition *)&e);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&picturePaths);
    std::__cxx11::string::~string((string *)picturesPath);
    return iVar3;
  }
  MesmerizeOptions::PrintOptions();
  exit(0);
}

Assistant:

int main(int argc, const char** argv)
{
    if (argc == 1){
        MesmerizeOptions::PrintOptions();
        exit(0);
    }

    MesmerizeOptions options;
    try {
        options = MesmerizeOptions::FromArgs(argc, argv);
    }catch(std::runtime_error e) {
        std::cout << "Unknown option: " << e.what() << "\n\n";
        MesmerizeOptions::PrintOptions();
        exit(1);
    }

    auto picturePaths = GetShuffledPicturePaths::GetShuffledPicturePaths(options.PathToPicturesFolder);
    if (picturePaths.empty()) {
        std::cout << "Folder " << options.PathToPicturesFolder << " has no pictures (.jpg or .png)\n";
        return 0;
    }

    PictureRendererWithTransition pictureRendererWithTransition(
            options.PanAnimationDuration,
            options.ZoomAnimationDuration,
            options.OpacityAnimationDuration,
            options.PanPercentage,
            options.ZoomPercentage);

    GLFWwindow *window;

    /* Initialize the library */
    if (!glfwInit())
        return -1;

    const GLFWvidmode *vidMode = glfwGetVideoMode(glfwGetPrimaryMonitor());
    int deviceWidth = vidMode->width;
    int deviceHeight = vidMode->height;

    if (options.IsFullScreen) {
        if (options.IsResolutionSetToMax) {
            window = glfwCreateWindow(deviceWidth, deviceHeight, "Mesmerize", glfwGetPrimaryMonitor(), NULL);
        } else {
            window = glfwCreateWindow(options.ResolutionX, options.ResolutionY, "Mesmerize", glfwGetPrimaryMonitor(),NULL);
        }
    }else {
        if (options.IsResolutionSetToMax) {
            window = glfwCreateWindow(deviceWidth, deviceHeight, "Mesmerize", NULL, NULL);
        } else {
            window = glfwCreateWindow(options.ResolutionX, options.ResolutionY, "Mesmerize", NULL, NULL);
        }
    }

    if (!window)
    {
        glfwTerminate();
        return -1;
    }
    /* Make the window's context current */
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, [](GLFWwindow* window, int key, int scancode, int action, int mods) {
        if (key == GLFW_KEY_ESCAPE){
#ifdef ENABLE_IMGUI
            GL_CALL(ImGui_ImplGlfw_Shutdown());
            GL_CALL(ImGui_ImplOpenGL3_Shutdown());
            GL_CALL(ImGui::DestroyContext());
#endif
            glfwTerminate();
            exit(0);
        }
    });

    DeviceInformation::init(window, deviceWidth, deviceHeight);

#ifdef ENABLE_IMGUI
    GL_CALL(ImGui::CreateContext());
    GL_CALL(ImGui_ImplGlfw_InitForOpenGL(window, true));
    GL_CALL(ImGui_ImplOpenGL3_Init("#version 300 es"));
#endif

    GLenum err = glewInit();

    if (GLEW_OK != err)
    {
        /* Problem: glewInit failed, something is seriously wrong. */
        fprintf(stderr, "Error: %s\n", glewGetErrorString(err));
    }

#if ENABLE_GL_DEBUG_OUTPUT
    fprintf(stdout, "Status: Using GLEW %s\n", glewGetString(GLEW_VERSION));
    // During init, enable debug output
    GL_CALL(glEnable(GL_DEBUG_OUTPUT));
    GL_CALL(glDebugMessageCallback(MessageCallback, 0));
#endif

    GL_CALL(glEnable(GL_BLEND));
    GL_CALL(glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA));
    GL_CALL(glBlendEquation(GL_FUNC_ADD));


    Picture::InitShaders();

    glfwSwapInterval(1);

    Renderer renderer;
    /* Loop until the user closes the window */
    static int counter = 0;
    ManualTicker manualTicker([&] {
        int index = ++counter % picturePaths.size();
        manualTicker.Pause(15000); //some pictures take a considerable amount of time to load in the pi, more than 15 secs probably there was an error and the event is not coming
        pictureRendererWithTransition.Load(picturePaths[index], [&manualTicker]() {
            manualTicker.Resume();
        });
    }, options.DisplayPictureDuration);

    while (!glfwWindowShouldClose(window))
    {
        manualTicker.Tick(); //will trigger the change of picture if enough time has passed
        /* Render here */
        renderer.Clear();

#ifdef ENABLE_IMGUI
        GL_CALL(ImGui_ImplOpenGL3_NewFrame());
        GL_CALL(ImGui_ImplGlfw_NewFrame());
        GL_CALL(ImGui::NewFrame());
        {
            GL_CALL(ImGui::Begin("Debug"));

            if (ImGui::Button("<"))
            { // Buttons return true when clicked (most widgets return true when edited/activated)
                int index = --counter % picturePaths.size();
                pictureRendererWithTransition.Load(picturePaths[index]);
            }

            ImGui::SameLine();
            if (ImGui::Button(">"))
            { // Buttons return true when clicked (most widgets return true when edited/activated)
                int index = ++counter % picturePaths.size();
                pictureRendererWithTransition.Load(picturePaths[index]);
            }
            ImGui::SameLine();
            ImGui::Text("counter = %d", counter);

            ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
            ImGui::End();
        }
#endif

        pictureRendererWithTransition.Render();

#ifdef ENABLE_IMGUI
        GL_CALL(ImGui::Render());
        GL_CALL(ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData()));
#endif
        /* Swap front and back buffers */
        glfwSwapBuffers(window);

        /* Poll for and process events */
        glfwPollEvents();
    }

#ifdef ENABLE_IMGUI
    GL_CALL(ImGui_ImplGlfw_Shutdown());
    GL_CALL(ImGui_ImplOpenGL3_Shutdown());
    GL_CALL(ImGui::DestroyContext());
#endif
    glfwTerminate();
    return 0;
}